

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O1

void __thiscall rengine::GlyphTextureJob::onExecute(GlyphTextureJob *this)

{
  char *pcVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  uint *puVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  GlyphTextureJob *pGVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  uchar *output;
  ostream *poVar10;
  int out_h;
  long lVar11;
  int iVar12;
  stbtt_fontinfo *psVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  int local_11c;
  ulong uStack_118;
  int lineGap;
  ulong local_110;
  element_type *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  void *pvStack_d8;
  vector<float,_std::allocator<float>_> advances;
  int local_b4;
  int local_b0;
  int descent;
  int x1;
  int y0;
  int y1;
  float local_9c;
  pointer piStack_98;
  vector<int,_std::allocator<int>_> glyphs;
  uint *puStack_78;
  int g;
  int local_5c;
  stbtt_fontinfo *psStack_58;
  int ascent;
  GlyphTextureJob *local_50;
  int local_48;
  int local_44;
  int leftSideBearing;
  int x0;
  int advance;
  float local_34;
  float xpos;
  
  local_e0 = std::chrono::_V2::system_clock::now();
  psVar13 = &this->m_context->m_fontInfo;
  local_34 = stbtt_ScaleForPixelHeight(psVar13,(float)this->m_pixelSize);
  psStack_58 = psVar13;
  stbtt_GetFontVMetrics(psVar13,&local_5c,&local_b4,&local_11c);
  uVar9 = 0;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  piStack_98 = (pointer)0x0;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pvStack_d8 = (void *)0x0;
  advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  advance = 0;
  pcVar8 = (this->m_text)._M_dataplus._M_p;
  iVar12 = 0;
  local_50 = this;
  if (*pcVar8 != '\0') {
    iVar12 = 0;
    lVar11 = 1;
    uVar14 = 0;
    do {
      iVar7 = stbtt_FindGlyphIndex(psStack_58,(int)*pcVar8);
      puStack_78 = (uint *)CONCAT44(puStack_78._4_4_,iVar7);
      if (1 < lVar11 - 1U) {
        iVar7 = stbtt_GetCodepointKernAdvance
                          (psStack_58,
                           glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[-1],iVar7);
        advance = (int)((float)iVar7 * local_34 + (float)advance);
      }
      psVar13 = psStack_58;
      stbtt_GetGlyphHMetrics(psStack_58,(int)puStack_78,&leftSideBearing,&local_48);
      x0 = advance;
      fVar15 = floorf((float)advance);
      stbtt_GetGlyphBitmapBoxSubpixel
                (psVar13,(int)puStack_78,local_34,local_34,(float)x0 - fVar15,0.0,&local_44,&descent
                 ,&local_b0,&x1);
      iVar7 = local_b0 - local_44;
      if (local_b0 - local_44 <= iVar12) {
        iVar7 = iVar12;
      }
      iVar12 = iVar7;
      uVar9 = (ulong)(uint)(x1 - descent);
      if (x1 - descent <= (int)uVar14) {
        uVar9 = uVar14;
      }
      advance = (int)((float)(leftSideBearing - local_48) * local_34 + (float)advance);
      if (advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start ==
          advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&pvStack_d8,
                   (iterator)
                   advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(float *)&advance);
      }
      else {
        *advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start = (float)advance;
        advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      if (glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&piStack_98,
                   (iterator)
                   glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(int *)&puStack_78);
      }
      else {
        *glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)puStack_78;
        glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      pcVar2 = (local_50->m_text)._M_dataplus._M_p;
      pcVar8 = pcVar2 + lVar11;
      pcVar1 = pcVar2 + lVar11;
      lVar11 = lVar11 + 1;
      uVar14 = uVar9;
    } while (*pcVar1 != '\0');
  }
  fVar15 = ceilf((float)advance);
  pGVar6 = local_50;
  local_50->m_textureWidth = (int)fVar15;
  fVar16 = ceilf((float)(local_5c - local_b4) * local_34);
  pGVar6->m_textureHeight = (int)fVar16;
  local_110 = uVar9;
  y1 = iVar12;
  output = (uchar *)malloc((ulong)(uint)(iVar12 * (int)uVar9));
  local_108 = (element_type *)calloc((long)((int)fVar16 * (int)fVar15),4);
  puStack_78 = local_108;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(void*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&g,local_108,free);
  _Var5._M_pi = _g;
  puVar4 = puStack_78;
  puStack_78 = (uint *)0x0;
  _g = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pGVar6->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pGVar6->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       puVar4;
  (pGVar6->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_g != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_g);
  }
  if (glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != piStack_98) {
    fVar15 = (local_50->m_color).w;
    local_100 = (ulong)(uint)(int)(fVar15 * 255.0);
    local_f8 = (ulong)(uint)(int)((local_50->m_color).x * fVar15 * 255.0);
    local_f0 = (ulong)(uint)(int)((local_50->m_color).y * fVar15 * 255.0);
    local_e8 = (ulong)(uint)(int)(fVar15 * (local_50->m_color).z * 255.0);
    local_9c = local_34 * (float)local_5c;
    fVar15 = 0.0;
    uVar9 = 0;
    uVar14 = 1;
    do {
      iVar12 = piStack_98[uVar9];
      x0 = (int)fVar15;
      fVar15 = floorf(fVar15);
      y0 = (int)((float)x0 - fVar15);
      stbtt_GetGlyphBitmapBoxSubpixel
                (psStack_58,iVar12,local_34,local_34,(float)y0,0.0,(int *)&puStack_78,
                 &leftSideBearing,&local_48,&local_44);
      iVar7 = local_48 - (int)puStack_78;
      uStack_118 = uVar9;
      if (y1 < iVar7) {
        __assert_fail("x1 - x0 <= maxBmWidth",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xc2,"virtual void rengine::GlyphTextureJob::onExecute()");
      }
      out_h = local_44 - leftSideBearing;
      if ((int)local_110 < out_h) {
        __assert_fail("y1 - y0 <= maxBmHeight",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xc3,"virtual void rengine::GlyphTextureJob::onExecute()");
      }
      stbtt_MakeGlyphBitmapSubpixel
                (psStack_58,output,iVar7,out_h,iVar7,local_34,local_34,(float)y0,0.0,iVar12);
      renderSingleGlyph(local_50,(int)(float)x0,(int)((float)leftSideBearing + local_9c),local_108,
                        local_50->m_textureWidth,local_50->m_textureHeight,output,iVar7,out_h,
                        (int)local_f8,(int)local_f0,(int)local_e8,(int)local_100);
      fVar15 = *(float *)((long)pvStack_d8 + uStack_118 * 4);
      bVar3 = uVar14 < (ulong)((long)glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start - (long)piStack_98 >> 2);
      uVar9 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar3);
  }
  free(output);
  lVar11 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generated glyph texture for \'",0x1d);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(local_50->m_text)._M_dataplus._M_p,
                       (local_50->m_text)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\' in ",5);
  poVar10 = std::ostream::_M_insert<double>(((double)(lVar11 - local_e0) / 1000000000.0) * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (pvStack_d8 != (void *)0x0) {
    operator_delete(pvStack_d8);
  }
  if (piStack_98 != (pointer)0x0) {
    operator_delete(piStack_98);
  }
  return;
}

Assistant:

inline void GlyphTextureJob::onExecute()
{
    auto start = std::chrono::system_clock::now();

    const stbtt_fontinfo *fontInfo = m_context->fontInfo();
    float scale = stbtt_ScaleForPixelHeight(fontInfo, m_pixelSize);

    int ascent, descent, lineGap;
    stbtt_GetFontVMetrics(fontInfo, &ascent, &descent, &lineGap);

    // std::cout << "GlyphTextureJob::onExecute: text='" << m_text
    //           << "', size=" << m_pixelSize
    //           << ", scale=" << scale
    //           << ", ascent=" << ascent
    //           << ", descent=" << descent
    //           << ", lineGap=" << lineGap
    //           << std::endl;

    std::vector<int> glyphs;
    std::vector<float> advances;

    float xpos = 0;

    int maxBmWidth = 0;
    int maxBmHeight = 0;

    for (int i=0; m_text[i]; ++i) {
        int g = stbtt_FindGlyphIndex(fontInfo, m_text[i]);
        if (i > 1) {
            xpos += scale*stbtt_GetCodepointKernAdvance(fontInfo, glyphs.back(), g);
        }
        int advance, leftSideBearing;
        stbtt_GetGlyphHMetrics(fontInfo, g, &advance, &leftSideBearing);

        float xShift = xpos - (float) std::floor(xpos);
        int x0, x1, y0, y1;
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, g, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);
        maxBmWidth = std::max(x1 - x0, maxBmWidth);
        maxBmHeight = std::max(y1 - y0, maxBmHeight);

        // std::cout << " - '" << m_text[i] << "': index=" << g << ", advance=" << advance << "/" << xpos << ", lsb=" << leftSideBearing
        //           << ", box=" << x0 << "-" << x1 << ", " << y0 << "-" << y1 << std::endl;

        xpos += scale * (advance - leftSideBearing);

        advances.push_back(xpos);
        glyphs.push_back(g);
    }

    m_textureWidth = std::ceil(xpos);
    m_textureHeight = std::ceil((ascent - descent) * scale);

    // std::cout << " - dimensions texture=" << m_textureWidth << "x" << m_textureHeight
    //           << ", bitmap=" << maxBmWidth << "x" << maxBmHeight << std::endl;

    unsigned char *bmData = (unsigned char *) malloc(maxBmWidth * maxBmHeight);
    unsigned int *textureData = (unsigned int *) calloc(m_textureWidth * m_textureHeight, 4);
    m_textureData = std::shared_ptr<unsigned int>(textureData, free);

    int ca = m_color.w * 255;
    int cr = m_color.w * m_color.x * 255;
    int cg = m_color.w * m_color.y * 255;
    int cb = m_color.w * m_color.z * 255;

    float x = 0;
    float y = ascent * scale;
    for (unsigned i=0; i<glyphs.size(); ++i) {
        int glyph = glyphs[i];

        int x0, y0, x1, y1;

        float xShift = x - (float) std::floor(x);
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, glyph, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);

        assert(x1 - x0 <= maxBmWidth);
        assert(y1 - y0 <= maxBmHeight);

        int bmw = x1 - x0;
        int bmh = y1 - y0;
        stbtt_MakeGlyphBitmapSubpixel(fontInfo, bmData, bmw, bmh, bmw, scale, scale, xShift, 0, glyph);

        renderSingleGlyph(x, y + y0,
                          textureData, m_textureWidth, m_textureHeight,
                          bmData, bmw, bmh,
                          cr, cg, cb, ca);

        x = advances[i];
    }

    free(bmData);

    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end - start;
    std::cout << "generated glyph texture for '" << m_text << "' in " << diff.count() * 1000 << " ms" << std::endl;
}